

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFactoryRegistry.cpp
# Opt level: O0

TestFactoryRegistry * __thiscall
CppUnit::TestFactoryRegistryList::getInternalRegistry(TestFactoryRegistryList *this,string *name)

{
  bool bVar1;
  TestFactoryRegistry *this_00;
  reference ppVar2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CppUnit::TestFactoryRegistry_*>
  local_a0;
  undefined1 local_75;
  string local_68;
  TestFactoryRegistry *local_48;
  TestFactoryRegistry *factory;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CppUnit::TestFactoryRegistry_*>_>
  local_38;
  iterator local_30;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CppUnit::TestFactoryRegistry_*>_>
  local_28;
  const_iterator foundIt;
  string *name_local;
  TestFactoryRegistryList *this_local;
  
  foundIt._M_node = (_Base_ptr)name;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CppUnit::TestFactoryRegistry_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CppUnit::TestFactoryRegistry_*>_>_>
       ::find(&this->m_registries,name);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CppUnit::TestFactoryRegistry_*>_>
  ::_Rb_tree_const_iterator(&local_28,&local_30);
  factory = (TestFactoryRegistry *)
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CppUnit::TestFactoryRegistry_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CppUnit::TestFactoryRegistry_*>_>_>
            ::end(&this->m_registries);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CppUnit::TestFactoryRegistry_*>_>
  ::_Rb_tree_const_iterator(&local_38,(iterator *)&factory);
  bVar1 = std::operator==(&local_28,&local_38);
  if (bVar1) {
    this_00 = (TestFactoryRegistry *)operator_new(0x58);
    local_75 = 1;
    std::__cxx11::string::string((string *)&local_68,(string *)foundIt._M_node);
    TestFactoryRegistry::TestFactoryRegistry(this_00,&local_68);
    local_75 = 0;
    std::__cxx11::string::~string((string *)&local_68);
    local_48 = this_00;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CppUnit::TestFactoryRegistry_*>
    ::pair<CppUnit::TestFactoryRegistry_*&,_true>
              (&local_a0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)foundIt._M_node,
               &local_48);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CppUnit::TestFactoryRegistry_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CppUnit::TestFactoryRegistry_*>_>_>
    ::insert(&this->m_registries,&local_a0);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CppUnit::TestFactoryRegistry_*>
    ::~pair(&local_a0);
    this_local = (TestFactoryRegistryList *)local_48;
  }
  else {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CppUnit::TestFactoryRegistry_*>_>
             ::operator*(&local_28);
    this_local = (TestFactoryRegistryList *)ppVar2->second;
  }
  return (TestFactoryRegistry *)this_local;
}

Assistant:

TestFactoryRegistry *getInternalRegistry( const std::string &name )
  {
    Registries::const_iterator foundIt = m_registries.find( name );
    if ( foundIt == m_registries.end() )
    {
      TestFactoryRegistry *factory = new TestFactoryRegistry( name );
      m_registries.insert( std::pair<const std::string, TestFactoryRegistry*>( name, factory ) );
      return factory;
    }
    return (*foundIt).second;
  }